

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

iterator __thiscall
QHash<ProKey,_ProKey>::emplace_helper<ProKey>(QHash<ProKey,_ProKey> *this,ProKey *key,ProKey *args)

{
  piter pVar1;
  Node<ProKey,_ProKey> *this_00;
  long in_FS_OFFSET;
  undefined1 local_48 [32];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_48._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QHashPrivate::Data<QHashPrivate::Node<ProKey,_ProKey>_>::findOrInsert<ProKey>
            ((InsertionResult *)local_48,this->d,key);
  this_00 = (Node<ProKey,_ProKey> *)
            ((((*(Span **)(local_48._0_8_ + 0x20))[(ulong)local_48._8_8_ >> 7].entries)->storage).
             data + (uint)(*(Span **)(local_48._0_8_ + 0x20))[(ulong)local_48._8_8_ >> 7].offsets
                          [(uint)local_48._8_8_ & 0x7f] * 0x60);
  if (local_48[0x10] == false) {
    ProString::ProString((ProString *)this_00,&key->super_ProString);
    ProString::ProString(&(this_00->value).super_ProString,&args->super_ProString);
  }
  else {
    QHashPrivate::Node<ProKey,_ProKey>::emplaceValue<ProKey>(this_00,args);
  }
  pVar1.bucket = local_48._8_8_;
  pVar1.d = (Data<QHashPrivate::Node<ProKey,_ProKey>_> *)local_48._0_8_;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return (iterator)pVar1;
  }
  __stack_chk_fail();
}

Assistant:

iterator emplace_helper(Key &&key, Args &&... args)
    {
        auto result = d->findOrInsert(key);
        if (!result.initialized)
            Node::createInPlace(result.it.node(), std::move(key), std::forward<Args>(args)...);
        else
            result.it.node()->emplaceValue(std::forward<Args>(args)...);
        return iterator(result.it);
    }